

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * stripPrefix(string *__return_storage_ptr__,string *value,string *prefix)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,value);
  __x._M_str = (prefix->_M_dataplus)._M_p;
  __x._M_len = prefix->_M_string_length;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(__return_storage_ptr__,__x);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,0,prefix->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string stripPrefix( std::string const & value, std::string const & prefix )
{
  std::string strippedValue = value;
  if ( strippedValue.starts_with( prefix ) )
  {
    strippedValue.erase( 0, prefix.length() );
  }
  return strippedValue;
}